

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_encode(NTRUEncodeSchedule *sched,uint16_t *rs_in,BinarySink *bs)

{
  long lVar1;
  ushort uVar2;
  size_t factor1;
  void *b;
  ulong uVar3;
  uint32_t r2;
  uint32_t r1;
  uint32_t r;
  uint16_t op;
  size_t i_1;
  size_t tail;
  size_t head;
  size_t i;
  uint32_t *rs;
  size_t n;
  BinarySink *bs_local;
  uint16_t *rs_in_local;
  NTRUEncodeSchedule *sched_local;
  
  factor1 = sched->nvals;
  b = safemalloc(factor1,4,0);
  for (head = 0; head < factor1; head = head + 1) {
    *(uint *)((long)b + head * 4) = (uint)rs_in[head];
  }
  tail = 0;
  i_1 = factor1 - 1;
  for (_r = 0; _r < sched->nops; _r = _r + 1) {
    uVar2 = (ushort)sched->ops[_r];
    if (uVar2 == 0) {
      lVar1 = tail * 4;
      tail = (tail + 1) % factor1;
      i_1 = (i_1 + 1) % factor1;
      *(undefined4 *)((long)b + i_1 * 4) = *(undefined4 *)((long)b + lVar1);
    }
    else if (uVar2 == 1) {
      BinarySink_put_byte(bs->binarysink_,(uchar)*(undefined4 *)((long)b + i_1 * 4));
      *(uint *)((long)b + i_1 * 4) = *(uint *)((long)b + i_1 * 4) >> 8;
    }
    else {
      lVar1 = tail * 4;
      uVar3 = (tail + 1) % factor1;
      tail = (uVar3 + 1) % factor1;
      i_1 = (i_1 + 1) % factor1;
      *(uint *)((long)b + i_1 * 4) =
           *(int *)((long)b + lVar1) + (uVar2 - 2) * *(int *)((long)b + uVar3 * 4);
    }
  }
  if (tail != sched->endpos) {
    __assert_fail("head == sched->endpos",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x316,"void ntru_encode(NTRUEncodeSchedule *, const uint16_t *, BinarySink *)");
  }
  if (i_1 != sched->endpos) {
    __assert_fail("tail == sched->endpos",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x317,"void ntru_encode(NTRUEncodeSchedule *, const uint16_t *, BinarySink *)");
  }
  if (*(int *)((long)b + tail * 4) == 0) {
    smemclr(b,factor1 << 2);
    safefree(b);
    return;
  }
  __assert_fail("rs[head] == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                0x318,"void ntru_encode(NTRUEncodeSchedule *, const uint16_t *, BinarySink *)");
}

Assistant:

void ntru_encode(NTRUEncodeSchedule *sched, const uint16_t *rs_in,
                 BinarySink *bs)
{
    size_t n = sched->nvals;
    uint32_t *rs = snewn(n, uint32_t);
    for (size_t i = 0; i < n; i++)
        rs[i] = rs_in[i];

    /*
     * The head and tail pointers of the queue are both 'full'. That
     * is, rs[head] is the first element actually in the queue, and
     * rs[tail] is the last element.
     *
     * So you append to the queue by first advancing 'tail' and then
     * writing to rs[tail], whereas you consume from the queue by
     * first reading rs[head] and _then_ advancing 'head'.
     *
     * The more normal thing would be to make 'tail' point to the
     * first empty slot instead of the last full one. But then you'd
     * have to faff about with modular arithmetic to find the last
     * full slot for the BYTE command, so in this case, it's easier to
     * do it the less usual way.
     */
    size_t head = 0, tail = n-1;

    for (size_t i = 0; i < sched->nops; i++) {
        uint16_t op = sched->ops[i];
        switch (op) {
          case ENC_BYTE:
            put_byte(bs, rs[tail] & 0xFF);
            rs[tail] >>= 8;
            break;
          case ENC_COPY: {
            uint32_t r = rs[head];
            head = (head + 1) % n;
            tail = (tail + 1) % n;
            rs[tail] = r;
            break;
          }
          default: {
            uint32_t r1 = rs[head];
            head = (head + 1) % n;
            uint32_t r2 = rs[head];
            head = (head + 1) % n;
            tail = (tail + 1) % n;
            rs[tail] = r1 + (op - ENC_COMBINE_BASE) * r2;
            break;
          }
        }
    }

    /*
     * Expect that we've ended up with a single zero in the queue, at
     * exactly the position that the setup-time analysis predicted it.
     */
    assert(head == sched->endpos);
    assert(tail == sched->endpos);
    assert(rs[head] == 0);

    smemclr(rs, n * sizeof(*rs));
    sfree(rs);
}